

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * received_time_to_db_string(char *string_buf,size_t string_buf_len)

{
  undefined1 local_58 [8];
  tm ptm;
  time_t rawtime;
  size_t string_buf_len_local;
  char *string_buf_local;
  
  memset(local_58,0,0x38);
  time((time_t *)&ptm.tm_zone);
  localtime_r((time_t *)&ptm.tm_zone,(tm *)local_58);
  strftime(string_buf,string_buf_len,"%Y%m%d,%H%M%S",(tm *)local_58);
  return string_buf;
}

Assistant:

char* received_time_to_db_string(char *string_buf, size_t string_buf_len) {
    time_t rawtime;
    struct tm ptm = { 0 };

    time(&rawtime);
    localtime_r(&rawtime, &ptm);
    strftime(string_buf, string_buf_len, "%Y%m%d,%H%M%S", &ptm);
    return string_buf;
}